

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_softmaxnd(NeuralNetworkLayer *this)

{
  ulong uVar1;
  SoftmaxNDLayerParams *pSVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x3b6) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b6;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pSVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::SoftmaxNDLayerParams>(arena);
    (this->layer_).softmaxnd_ = pSVar2;
  }
  return (SoftmaxNDLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxNDLayerParams* NeuralNetworkLayer::_internal_mutable_softmaxnd() {
  if (!_internal_has_softmaxnd()) {
    clear_layer();
    set_has_softmaxnd();
    layer_.softmaxnd_ = CreateMaybeMessage< ::CoreML::Specification::SoftmaxNDLayerParams >(GetArenaForAllocation());
  }
  return layer_.softmaxnd_;
}